

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

int fe_shift_frame(fe_t *fe,int16 *in,int32 len)

{
  ushort *puVar1;
  int16 *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  uVar3 = (uint)fe->frame_shift;
  if ((int)uVar3 < len) {
    len = uVar3;
  }
  iVar5 = (int)fe->frame_size - uVar3;
  lVar6 = (long)iVar5;
  memmove(fe->spch,fe->spch + fe->frame_shift,lVar6 * 2);
  memcpy(fe->spch + lVar6,in,(long)len * 2);
  uVar7 = (ulong)(uint)len;
  if (0 < len && fe->swap != '\0') {
    piVar2 = fe->spch;
    uVar4 = 0;
    do {
      puVar1 = (ushort *)(piVar2 + (long)iVar5 + uVar4);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
  }
  if (0 < len && fe->dither != '\0') {
    do {
      uVar4 = genrand_int31();
      fe->spch[lVar6] = fe->spch[lVar6] + (ushort)((uVar4 & 3) == 0);
      lVar6 = lVar6 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  iVar5 = fe_spch_to_frame(fe,iVar5 + len);
  return iVar5;
}

Assistant:

int
fe_shift_frame(fe_t * fe, int16 const *in, int32 len)
{
    int offset, i;

    if (len > fe->frame_shift)
        len = fe->frame_shift;
    offset = fe->frame_size - fe->frame_shift;

    /* Shift data into the raw speech buffer. */
    memmove(fe->spch, fe->spch + fe->frame_shift,
            offset * sizeof(*fe->spch));
    memcpy(fe->spch + offset, in, len * sizeof(*fe->spch));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[offset + i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[offset + i]
                += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, offset + len);
}